

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O3

void __thiscall Js::InlineCache::Dump(InlineCache *this)

{
  ushort uVar1;
  DynamicObject *pDVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  Type *pTVar7;
  char16_t *form;
  InlineCache **ppIVar8;
  
  if ((undefined1  [24])((undefined1  [24])this->u & (undefined1  [24])0x1) != (undefined1  [24])0x0
     ) {
    pTVar6 = (this->u).local.type;
    pTVar7 = (this->u).local.typeWithoutProperty;
    uVar1 = (this->u).local.slotIndex;
    ppIVar8 = this->invalidationListSlotPtr;
    form = L"LOCAL { types: 0x%X -> 0x%X, slot = %d, list slot ptr = 0x%X }";
LAB_00970680:
    Output::Print(form,pTVar7,pTVar6,(ulong)uVar1,ppIVar8);
    return;
  }
  if ((undefined1  [24])((undefined1  [24])this->u & (undefined1  [24])0x1) != (undefined1  [24])0x0
     ) {
    pTVar7 = (this->u).local.typeWithoutProperty;
    pTVar6 = (Type *)(this->u).proto.prototypeObject;
    uVar1 = (this->u).proto.slotIndex;
    ppIVar8 = this->invalidationListSlotPtr;
    form = L"PROTO { type = 0x%X, prototype = 0x%X, slot = %d, list slot ptr = 0x%X }";
    goto LAB_00970680;
  }
  uVar1 = *(ushort *)((long)&this->u + 8);
  pDVar2 = (this->u).proto.prototypeObject;
  if ((uVar1 & 1) != 0) {
    Output::Print(L"FLAGS { type = 0x%X, object = 0x%X, flag = 0x%X, slot = %d, list slot ptr = 0x%X }"
                  ,pDVar2,(this->u).local.type,(ulong)(this->u).accessor.slotIndex,
                  (ulong)(uVar1 >> 1 & 3),this->invalidationListSlotPtr);
    return;
  }
  if (pDVar2 != (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x26a,"(this->u.accessor.type == 0)","this->u.accessor.type == 0");
    if (!bVar4) goto LAB_009706af;
    *puVar5 = 0;
  }
  if ((this->u).accessor.slotIndex != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x26b,"(this->u.accessor.slotIndex == 0)",
                                "this->u.accessor.slotIndex == 0");
    if (!bVar4) {
LAB_009706af:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  Output::Print(L"uninitialized");
  return;
}

Assistant:

void InlineCache::Dump()
    {
        if (this->u.local.isLocal)
        {
            Output::Print(_u("LOCAL { types: 0x%X -> 0x%X, slot = %d, list slot ptr = 0x%X }"),
                this->u.local.typeWithoutProperty,
                this->u.local.type,
                this->u.local.slotIndex,
                this->invalidationListSlotPtr
                );
        }
        else if (this->u.proto.isProto)
        {
            Output::Print(_u("PROTO { type = 0x%X, prototype = 0x%X, slot = %d, list slot ptr = 0x%X }"),
                this->u.proto.type,
                this->u.proto.prototypeObject,
                this->u.proto.slotIndex,
                this->invalidationListSlotPtr
                );
        }
        else if (this->u.accessor.isAccessor)
        {
            Output::Print(_u("FLAGS { type = 0x%X, object = 0x%X, flag = 0x%X, slot = %d, list slot ptr = 0x%X }"),
                this->u.accessor.type,
                this->u.accessor.object,
                this->u.accessor.slotIndex,
                this->u.accessor.flags,
                this->invalidationListSlotPtr
                );
        }
        else
        {
            Assert(this->u.accessor.type == 0);
            Assert(this->u.accessor.slotIndex == 0);
            Output::Print(_u("uninitialized"));
        }
    }